

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_initDStream(ZSTD_DStream *zds)

{
  uint uVar1;
  size_t err_code_1;
  size_t err_code;
  ZSTD_DStream *zds_local;
  
  zds_local = (ZSTD_DStream *)ZSTD_DCtx_reset(zds,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zds_local);
  if (uVar1 == 0) {
    zds_local = (ZSTD_DStream *)ZSTD_DCtx_refDDict(zds,(ZSTD_DDict *)0x0);
    uVar1 = ERR_isError((size_t)zds_local);
    if (uVar1 == 0) {
      zds_local = (ZSTD_DStream *)ZSTD_startingInputLength(zds->format);
    }
  }
  return (size_t)zds_local;
}

Assistant:

size_t ZSTD_initDStream(ZSTD_DStream* zds)
{
    DEBUGLOG(4, "ZSTD_initDStream");
    FORWARD_IF_ERROR(ZSTD_DCtx_reset(zds, ZSTD_reset_session_only), "");
    FORWARD_IF_ERROR(ZSTD_DCtx_refDDict(zds, NULL), "");
    return ZSTD_startingInputLength(zds->format);
}